

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-spa.c
# Opt level: O2

int lws_spa_process(lws_spa *spa,char *in,int len)

{
  char *vbuf;
  char *__s1;
  lws_urldecode_stateful *plVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  size_t len_00;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  char **ppcVar9;
  ulong uVar10;
  bool bVar11;
  
  if (spa == (lws_spa *)0x0) {
    _lws_log(1,"%s: NULL spa\n","lws_spa_process");
    iVar3 = -1;
  }
  else {
    iVar3 = 0;
    if (spa->finalized == '\0') {
      plVar1 = spa->s;
      vbuf = plVar1->name;
      __s1 = plVar1->temp;
      uVar10 = 0;
LAB_00135377:
      do {
        bVar11 = len == 0;
        len = len + -1;
        if (bVar11) {
          return 0;
        }
        uVar7 = plVar1->pos;
        len_00 = (size_t)uVar7;
        if (uVar7 == ~plVar1->mp + plVar1->out_len) {
          iVar3 = (*plVar1->output)(plVar1->data,vbuf,&plVar1->out,uVar7,0);
          if (iVar3 != 0) {
            return -1;
          }
          plVar1->pos = 0;
          len_00 = 0;
        }
      } while (MT_IGNORE3 < plVar1->state);
      iVar3 = (int)len_00;
      switch(plVar1->state) {
      case US_NAME:
        plVar1->field_0x22c = plVar1->field_0x22c & 0xfd;
        bVar2 = *in;
        if (bVar2 == 0x26) {
          plVar1->name[iVar3] = '\0';
          iVar3 = (*plVar1->output)(plVar1->data,vbuf,&plVar1->out,plVar1->pos,1);
          if (iVar3 != 0) {
            return -1;
          }
        }
        else {
          if (bVar2 != 0x3d) {
            if (0x1e < iVar3) {
              lwsl_hexdump_level(4,vbuf,len_00);
              _lws_log(4,"Name too long...\n");
              return -1;
            }
            in = (char *)((byte *)in + 1);
            plVar1->pos = iVar3 + 1;
            plVar1->name[iVar3] = bVar2;
            goto LAB_00135377;
          }
          plVar1->name[iVar3] = '\0';
        }
        plVar1->pos = 0;
        plVar1->state = US_IDLE;
        break;
      case US_IDLE:
        bVar2 = *in;
        if (bVar2 == 0x2b) {
          in = (char *)((byte *)in + 1);
          plVar1->pos = iVar3 + 1;
          plVar1->out[iVar3] = ' ';
          goto LAB_00135377;
        }
        if (bVar2 == 0x26) {
          plVar1->out[iVar3] = '\0';
          iVar3 = (*plVar1->output)(plVar1->data,vbuf,&plVar1->out,plVar1->pos,1);
          if (iVar3 != 0) {
            return -1;
          }
          plVar1->pos = 0;
          plVar1->state = US_NAME;
        }
        else {
          if (bVar2 != 0x25) {
            in = (char *)((byte *)in + 1);
            plVar1->pos = iVar3 + 1;
            plVar1->out[iVar3] = bVar2;
            goto LAB_00135377;
          }
          plVar1->state = US_PC1;
        }
        break;
      case US_PC1:
        bVar2 = char_to_hex(*in);
        if ((char)bVar2 < '\0') {
          return -1;
        }
        in = (char *)((byte *)in + 1);
        plVar1->sum = (uint)bVar2 << 4;
        plVar1->state = plVar1->state + US_IDLE;
        goto LAB_00135377;
      case US_PC2:
        bVar2 = char_to_hex(*in);
        if ((char)bVar2 < '\0') {
          return -1;
        }
        in = (char *)((byte *)in + 1);
        iVar3 = plVar1->pos;
        plVar1->pos = iVar3 + 1;
        plVar1->out[iVar3] = bVar2 | (byte)plVar1->sum;
        plVar1->state = US_IDLE;
        goto LAB_00135377;
      case MT_LOOK_BOUND_IN:
        iVar3 = plVar1->mp;
        while( true ) {
          bVar2 = *in;
          iVar5 = (int)len_00;
          if (plVar1->mime_boundary[iVar3] != 0 && bVar2 == plVar1->mime_boundary[iVar3]) break;
          if (iVar3 == 0) {
LAB_001356fe:
            plVar1->pos = iVar5 + 1;
            plVar1->out[iVar5] = bVar2;
            in = (char *)((byte *)in + 1);
            plVar1->mp = 0;
            goto LAB_00135377;
          }
          uVar7 = ~(uint)(byte)plVar1->field_0x22c >> 2 & 2;
          if (iVar3 < (int)uVar7) goto LAB_001356fe;
          memcpy(plVar1->out + iVar5,plVar1->mime_boundary + uVar7,(long)(int)(iVar3 - uVar7));
          uVar7 = plVar1->pos + plVar1->mp;
          len_00 = (size_t)uVar7;
          plVar1->pos = uVar7;
          plVar1->mp = 0;
          iVar3 = 0;
        }
        in = (char *)((byte *)in + 1);
        plVar1->mp = iVar3 + 1;
        if (plVar1->mime_boundary[(long)iVar3 + 1] == '\0') {
          plVar1->mp = 0;
          plVar1->state = MT_IGNORE1;
          iVar3 = (*plVar1->output)(plVar1->data,vbuf,&plVar1->out,iVar5,1);
          if (iVar3 != 0) {
            return -1;
          }
          plVar1->pos = 0;
          plVar1->content_disp[0] = '\0';
          plVar1->name[0] = '\0';
          plVar1->content_disp_filename[0] = '\0';
          plVar1->field_0x22c = plVar1->field_0x22c | 8;
        }
        goto LAB_00135377;
      case MT_HNAME:
        bVar2 = *in;
        bVar6 = bVar2 | 0x20;
        if (0x19 < (byte)(bVar2 + 0xbf)) {
          bVar6 = bVar2;
        }
        ppcVar9 = mp_hdr;
        iVar3 = 0;
        for (uVar8 = 0; uVar8 != 3; uVar8 = uVar8 + 1) {
          if (bVar6 == (*ppcVar9)[plVar1->mp]) {
            uVar10 = uVar8 & 0xffffffff;
          }
          iVar3 = iVar3 + (uint)(bVar6 == (*ppcVar9)[plVar1->mp]);
          ppcVar9 = ppcVar9 + 1;
        }
        in = (char *)((byte *)in + 1);
        if (iVar3 == 0) {
          plVar1->state = MT_IGNORE1;
          plVar1->mp = 0;
        }
        else {
          lVar4 = (long)plVar1->mp + 1;
          plVar1->mp = (int)lVar4;
          if ((iVar3 == 1) && (iVar3 = (int)uVar10, mp_hdr[iVar3][lVar4] == '\0')) {
            plVar1->mp = 0;
            plVar1->temp[0] = '\0';
            plVar1->field_0x22c = plVar1->field_0x22c & 0xfb;
            if (iVar3 == 2) {
              plVar1->state = MT_LOOK_BOUND_IN;
              uVar10 = 2;
            }
            else {
              plVar1->state = iVar3 + MT_DISP;
            }
          }
        }
        goto LAB_00135377;
      case MT_DISP:
        bVar2 = *in;
        if (bVar2 == 0x3b) {
          plVar1->field_0x22c = plVar1->field_0x22c | 4;
          plVar1->temp[0] = '\0';
LAB_001358e3:
          plVar1->mp = 0;
        }
        else if (bVar2 == 0x22) {
          plVar1->field_0x22c = plVar1->field_0x22c ^ 2;
        }
        else if (bVar2 == 0xd) {
          if ((plVar1->content_disp_filename[0] != '\0') &&
             (iVar3 = (*plVar1->output)(plVar1->data,vbuf,&plVar1->out,iVar3,2), iVar3 != 0)) {
            return -1;
          }
          plVar1->state = MT_IGNORE2;
        }
        else if ((plVar1->field_0x22c & 4) == 0) {
          if (*__s1 == '\0') {
            iVar3 = plVar1->mp;
            if ((long)iVar3 < 0x1f) {
              plVar1->mp = iVar3 + 1;
              plVar1->content_disp[iVar3] = bVar2;
              iVar3 = plVar1->mp;
            }
            if (iVar3 < 0x20) {
              plVar1->content_disp[iVar3] = '\0';
            }
          }
          else {
            iVar3 = strcmp(__s1,"name");
            if (iVar3 == 0) {
              iVar3 = plVar1->mp;
              if ((long)iVar3 < 0x1f) {
                plVar1->mp = iVar3 + 1;
                plVar1->name[iVar3] = bVar2;
                lVar4 = (long)plVar1->mp;
              }
              else {
                plVar1->mp = 0x1f;
                lVar4 = 0x1f;
              }
              vbuf[lVar4] = '\0';
            }
            else {
              iVar3 = strcmp(__s1,"filename");
              if (iVar3 == 0) {
                iVar3 = plVar1->mp;
                if ((long)iVar3 < 0xff) {
                  plVar1->mp = iVar3 + 1;
                  plVar1->content_disp_filename[iVar3] = bVar2;
                  iVar3 = plVar1->mp;
                }
                plVar1->content_disp_filename[iVar3] = '\0';
              }
            }
          }
        }
        else {
          iVar3 = plVar1->mp;
          if (bVar2 == 0x3d) {
            plVar1->temp[iVar3] = '\0';
            plVar1->field_0x22c = plVar1->field_0x22c & 0xfb;
            goto LAB_001358e3;
          }
          if ((iVar3 < 0x1f) && ((plVar1->field_0x22c & 2) != 0 || bVar2 != 0x20)) {
            plVar1->mp = iVar3 + 1;
            plVar1->temp[iVar3] = bVar2;
          }
        }
        in = (char *)((byte *)in + 1);
        goto LAB_00135377;
      case MT_TYPE:
        bVar2 = *in;
        if (bVar2 == 0xd) {
          plVar1->state = MT_IGNORE2;
        }
        else {
          iVar3 = plVar1->mp;
          if ((long)iVar3 < 0x1f) {
            plVar1->mp = iVar3 + 1;
            plVar1->content_type[iVar3] = bVar2;
            iVar3 = plVar1->mp;
          }
          plVar1->content_type[iVar3] = '\0';
        }
        break;
      case MT_IGNORE1:
        bVar2 = *in;
        if (bVar2 == 0xd) {
          plVar1->state = MT_IGNORE2;
          bVar2 = *in;
        }
        if (bVar2 == 0x2d) {
          plVar1->state = MT_IGNORE3;
        }
        break;
      case MT_IGNORE2:
        plVar1->mp = 0;
        if (*in == 10) {
          plVar1->state = MT_HNAME;
        }
        break;
      case MT_IGNORE3:
        bVar2 = *in;
        if (bVar2 == 0xd) {
          plVar1->state = MT_IGNORE1;
          bVar2 = *in;
        }
        if (bVar2 == 0x2d) {
          plVar1->state = MT_COMPLETED;
          (plVar1->wsi->http).rx_content_remain = 0;
        }
      }
      in = (char *)((byte *)in + 1);
      goto LAB_00135377;
    }
  }
  return iVar3;
}

Assistant:

int
lws_spa_process(struct lws_spa *spa, const char *in, int len)
{
	if (!spa) {
		lwsl_err("%s: NULL spa\n", __func__);
		return -1;
	}
	/* we reject any junk after the last part arrived and we finalized */
	if (spa->finalized)
		return 0;

	return lws_urldecode_s_process(spa->s, in, len);
}